

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

BSDF * __thiscall
pbrt::SubsurfaceMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (BSDF *__return_storage_ptr__,SubsurfaceMaterial *this,TextureEvalContext *param_3,
          undefined8 param_4,int *param_5)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  undefined4 extraout_var;
  uintptr_t iptr;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  float local_f4;
  Float local_f0;
  UniversalTextureEvaluator local_e9;
  undefined1 local_e8 [16];
  BxDFHandle local_d0;
  uintptr_t local_c8;
  uintptr_t local_c0;
  SampledSpectrum local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined1 extraout_var_00 [60];
  
  local_c0 = (this->uRoughness).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  local_68._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_68._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_60 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_58._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_58._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_50._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_50._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_48 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_40 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_38._0_4_ = param_3->dudy;
  uStack_38._4_4_ = param_3->dvdx;
  uStack_30._0_4_ = param_3->dvdy;
  uStack_30._4_4_ = param_3->faceIndex;
  local_f0 = UniversalTextureEvaluator::operator()(&local_e9,(FloatTextureHandle)&local_c0,*param_3)
  ;
  local_c8 = (this->vRoughness).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  local_a8._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_a8._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_a0 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_98._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_98._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_90._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_90._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_88 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_80 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_78._0_4_ = param_3->dudy;
  uStack_78._4_4_ = param_3->dvdx;
  uStack_70._0_4_ = param_3->dvdy;
  uStack_70._4_4_ = param_3->faceIndex;
  auVar5._0_4_ = UniversalTextureEvaluator::operator()
                           (&local_e9,(FloatTextureHandle)&local_c8,*param_3);
  auVar5._4_60_ = extraout_var_00;
  auVar4 = auVar5._0_16_;
  if (this->remapRoughness == true) {
    if (local_f0 < 0.0) {
      local_f0 = sqrtf(local_f0);
      auVar4 = ZEXT416((uint)auVar5._0_4_);
    }
    else {
      auVar1 = vsqrtss_avx(ZEXT416((uint)local_f0),ZEXT416((uint)local_f0));
      local_f0 = auVar1._0_4_;
    }
    if (auVar4._0_4_ < 0.0) {
      local_f4 = sqrtf(auVar4._0_4_);
      goto LAB_002f2aa4;
    }
    auVar4 = vsqrtss_avx(auVar4,auVar4);
  }
  local_f4 = auVar4._0_4_;
LAB_002f2aa4:
  local_e8 = ZEXT416((uint)this->eta);
  SampledSpectrum::SampledSpectrum(&local_b8,1.0);
  uVar2 = vcmpss_avx512f(local_e8,ZEXT416(0x3f800000),0);
  bVar3 = (bool)((byte)uVar2 & 1);
  local_d0.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
           )((ulong)param_5 | 0x5000000000000);
  *param_5 = (uint)bVar3 * 0x3f8020c5 + (uint)!bVar3 * local_e8._0_4_;
  *(undefined8 *)(param_5 + 1) = local_b8.values.values._0_8_;
  *(undefined8 *)(param_5 + 3) = local_b8.values.values._8_8_;
  *(ulong *)(param_5 + 5) = CONCAT44(extraout_var,local_f0) | (ulong)(uint)local_f4 << 0x20;
  BSDF::BSDF(__return_storage_ptr__,(Vector3f *)(param_3 + 1),(Normal3f *)&param_3[1].dpdx,
             (Normal3f *)&param_3[1].dpdy,(Vector3f *)&param_3[1].uv,&local_d0);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, const MaterialEvalContext &ctx,
                              SampledWavelengths &lambda,
                              DielectricInterfaceBxDF *bxdf) const {
        // Initialize BSDF for _SubsurfaceMaterial_

        Float urough = texEval(uRoughness, ctx), vrough = texEval(vRoughness, ctx);
        if (remapRoughness) {
            urough = TrowbridgeReitzDistribution::RoughnessToAlpha(urough);
            vrough = TrowbridgeReitzDistribution::RoughnessToAlpha(vrough);
        }
        TrowbridgeReitzDistribution distrib(urough, vrough);

        // Initialize _bsdf_ for smooth or rough dielectric
        *bxdf = DielectricInterfaceBxDF(eta, SampledSpectrum(1.f), distrib);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf);
    }